

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  sqlite3 *db;
  u8 uVar1;
  uint uVar2;
  Expr *pEVar3;
  uint uVar4;
  ulong uVar5;
  Select *pSVar6;
  long lVar7;
  long lVar8;
  IdList_item *pIVar9;
  
  if (pList == (ExprList *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)pList->nExpr;
  }
  db = pParse->db;
  if (pExpr == (Expr *)0x0 || pColumns == (IdList *)0x0) goto LAB_0017c41f;
  uVar1 = pExpr->op;
  uVar4 = pColumns->nId;
  uVar5 = (ulong)uVar4;
  if (uVar1 != 0x8a) {
    if (uVar1 == 0xb0) {
      uVar1 = pExpr->op2;
    }
    pSVar6 = (Select *)pExpr;
    if (uVar1 == 0xb1) {
LAB_0017c363:
      uVar2 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pList->nExpr;
    }
    else {
      uVar2 = 1;
      if (uVar1 == 0x8a) {
        pSVar6 = (pExpr->x).pSelect;
        goto LAB_0017c363;
      }
    }
    if (uVar4 != uVar2) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values",(ulong)uVar4,(ulong)uVar2);
      goto LAB_0017c41f;
    }
  }
  if (0 < (int)uVar4) {
    pIVar9 = pColumns->a;
    lVar7 = 0;
    do {
      pEVar3 = sqlite3ExprForVectorField(pParse,pExpr,(int)lVar7,(int)uVar5);
      if (pEVar3 != (Expr *)0x0) {
        pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
        if (pList == (ExprList *)0x0) {
          pList = (ExprList *)0x0;
        }
        else {
          pList->a[(long)pList->nExpr + -1].zEName = pIVar9->zName;
          pIVar9->zName = (char *)0x0;
        }
      }
      lVar7 = lVar7 + 1;
      uVar4 = pColumns->nId;
      uVar5 = (ulong)(int)uVar4;
      pIVar9 = pIVar9 + 1;
    } while (lVar7 < (long)uVar5);
  }
  if (((db->mallocFailed == '\0') && (pExpr->op == 0x8a)) && (pList != (ExprList *)0x0)) {
    pEVar3 = pList->a[lVar8].pExpr;
    pEVar3->pRight = pExpr;
    pEVar3->iTable = uVar4;
    pExpr = (Expr *)0x0;
  }
LAB_0017c41f:
  sqlite3ExprUnmapAndDelete(pParse,pExpr);
  sqlite3IdListDelete(db,pColumns);
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT,
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i, pColumns->nId);
    assert( pSubExpr!=0 || db->mallocFailed );
    if( pSubExpr==0 ) continue;
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zEName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );

    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprUnmapAndDelete(pParse, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}